

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O3

LogicalType *
duckdb::EnumTypeInfo::CreateType
          (LogicalType *__return_storage_ptr__,Vector *ordered_data,idx_t size)

{
  undefined8 uVar1;
  PhysicalType PVar2;
  InternalException *this;
  undefined1 local_61;
  idx_t local_60;
  undefined1 local_58 [32];
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_38;
  
  local_60 = size;
  PVar2 = DictType(size);
  if (PVar2 == UINT32) {
    local_58._0_8_ = (EnumTypeInfoTemplated<unsigned_char> *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::EnumTypeInfoTemplated<unsigned_int>,std::allocator<duckdb::EnumTypeInfoTemplated<unsigned_int>>,duckdb::Vector&,unsigned_long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
               (EnumTypeInfoTemplated<unsigned_int> **)local_58,
               (allocator<duckdb::EnumTypeInfoTemplated<unsigned_int>_> *)&local_61,ordered_data,
               &local_60);
  }
  else if (PVar2 == UINT16) {
    local_58._0_8_ = (EnumTypeInfoTemplated<unsigned_char> *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::EnumTypeInfoTemplated<unsigned_short>,std::allocator<duckdb::EnumTypeInfoTemplated<unsigned_short>>,duckdb::Vector&,unsigned_long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
               (EnumTypeInfoTemplated<unsigned_short> **)local_58,
               (allocator<duckdb::EnumTypeInfoTemplated<unsigned_short>_> *)&local_61,ordered_data,
               &local_60);
  }
  else {
    if (PVar2 != UINT8) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"Invalid Physical Type for ENUMs","");
      InternalException::InternalException(this,(string *)local_58);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58._0_8_ = (EnumTypeInfoTemplated<unsigned_char> *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::EnumTypeInfoTemplated<unsigned_char>,std::allocator<duckdb::EnumTypeInfoTemplated<unsigned_char>>,duckdb::Vector&,unsigned_long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
               (EnumTypeInfoTemplated<unsigned_char> **)local_58,
               (allocator<duckdb::EnumTypeInfoTemplated<unsigned_char>_> *)&local_61,ordered_data,
               &local_60);
  }
  uVar1 = local_58._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_013df038;
    }
    else {
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
LAB_013df038:
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
    }
  }
  LogicalType::LogicalType(__return_storage_ptr__,ENUM,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType EnumTypeInfo::CreateType(Vector &ordered_data, idx_t size) {
	// Generate EnumTypeInfo
	shared_ptr<ExtraTypeInfo> info;
	auto enum_internal_type = EnumTypeInfo::DictType(size);
	switch (enum_internal_type) {
	case PhysicalType::UINT8:
		info = make_shared_ptr<EnumTypeInfoTemplated<uint8_t>>(ordered_data, size);
		break;
	case PhysicalType::UINT16:
		info = make_shared_ptr<EnumTypeInfoTemplated<uint16_t>>(ordered_data, size);
		break;
	case PhysicalType::UINT32:
		info = make_shared_ptr<EnumTypeInfoTemplated<uint32_t>>(ordered_data, size);
		break;
	default:
		throw InternalException("Invalid Physical Type for ENUMs");
	}
	// Generate Actual Enum Type
	return LogicalType(LogicalTypeId::ENUM, info);
}